

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O1

void FWHT(fwht_t *data,uint bits)

{
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  fwht_t *pfVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  ushort uVar12;
  uint uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  
  auVar18 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
  auVar19 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
  auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  uVar6 = 1;
  do {
    uVar7 = (ulong)uVar6;
    auVar22 = vpbroadcastq_avx512f();
    lVar9 = 0;
    pfVar8 = data;
    do {
      uVar10 = 0;
      do {
        auVar23 = vpbroadcastq_avx512f();
        auVar24 = vporq_avx512f(auVar23,auVar18);
        auVar25 = vporq_avx512f(auVar23,auVar19);
        auVar26 = vporq_avx512f(auVar23,auVar20);
        auVar23 = vporq_avx512f(auVar23,auVar21);
        uVar1 = vpcmpuq_avx512f(auVar23,auVar22,2);
        bVar2 = (byte)uVar1;
        uVar1 = vpcmpuq_avx512f(auVar26,auVar22,2);
        bVar3 = (byte)uVar1;
        uVar1 = vpcmpuq_avx512f(auVar25,auVar22,2);
        bVar4 = (byte)uVar1;
        uVar1 = vpcmpuq_avx512f(auVar24,auVar22,2);
        bVar5 = (byte)uVar1;
        uVar12 = CONCAT11(bVar5,bVar4);
        uVar13 = CONCAT22(uVar12,CONCAT11(bVar3,bVar2));
        auVar23 = vmovdqu16_avx512bw(*(undefined1 (*) [64])(pfVar8 + uVar10));
        auVar14._2_2_ = (ushort)((byte)(uVar13 >> 1) & 1) * auVar23._2_2_;
        auVar14._0_2_ = (ushort)(bVar2 & 1) * auVar23._0_2_;
        auVar14._4_2_ = (ushort)((byte)(uVar13 >> 2) & 1) * auVar23._4_2_;
        auVar14._6_2_ = (ushort)((byte)(uVar13 >> 3) & 1) * auVar23._6_2_;
        auVar14._8_2_ = (ushort)((byte)(uVar13 >> 4) & 1) * auVar23._8_2_;
        auVar14._10_2_ = (ushort)((byte)(uVar13 >> 5) & 1) * auVar23._10_2_;
        auVar14._12_2_ = (ushort)((byte)(uVar13 >> 6) & 1) * auVar23._12_2_;
        auVar14._14_2_ = (ushort)((byte)(uVar13 >> 7) & 1) * auVar23._14_2_;
        auVar14._16_2_ = (ushort)(bVar3 & 1) * auVar23._16_2_;
        auVar14._18_2_ = (ushort)((byte)(uVar13 >> 9) & 1) * auVar23._18_2_;
        auVar14._20_2_ = (ushort)((byte)(uVar13 >> 10) & 1) * auVar23._20_2_;
        auVar14._22_2_ = (ushort)((byte)(uVar13 >> 0xb) & 1) * auVar23._22_2_;
        auVar14._24_2_ = (ushort)((byte)(uVar13 >> 0xc) & 1) * auVar23._24_2_;
        auVar14._26_2_ = (ushort)((byte)(uVar13 >> 0xd) & 1) * auVar23._26_2_;
        auVar14._28_2_ = (ushort)((byte)(uVar13 >> 0xe) & 1) * auVar23._28_2_;
        auVar14._30_2_ = (ushort)((byte)(uVar13 >> 0xf) & 1) * auVar23._30_2_;
        auVar24._32_2_ = (ushort)(bVar4 & 1) * auVar23._32_2_;
        auVar24._0_32_ = auVar14;
        auVar24._34_2_ = (ushort)((byte)(uVar12 >> 1) & 1) * auVar23._34_2_;
        auVar24._36_2_ = (ushort)((byte)(uVar12 >> 2) & 1) * auVar23._36_2_;
        auVar24._38_2_ = (ushort)((byte)(uVar12 >> 3) & 1) * auVar23._38_2_;
        auVar24._40_2_ = (ushort)((byte)(uVar12 >> 4) & 1) * auVar23._40_2_;
        auVar24._42_2_ = (ushort)((byte)(uVar12 >> 5) & 1) * auVar23._42_2_;
        auVar24._44_2_ = (ushort)((byte)(uVar12 >> 6) & 1) * auVar23._44_2_;
        auVar24._46_2_ = (ushort)((byte)(uVar12 >> 7) & 1) * auVar23._46_2_;
        auVar24._48_2_ = (ushort)(bVar5 & 1) * auVar23._48_2_;
        auVar24._50_2_ = (ushort)(bVar5 >> 1 & 1) * auVar23._50_2_;
        auVar24._52_2_ = (ushort)(bVar5 >> 2 & 1) * auVar23._52_2_;
        auVar24._54_2_ = (ushort)(bVar5 >> 3 & 1) * auVar23._54_2_;
        auVar24._56_2_ = (ushort)(bVar5 >> 4 & 1) * auVar23._56_2_;
        auVar24._58_2_ = (ushort)(bVar5 >> 5 & 1) * auVar23._58_2_;
        auVar24._60_2_ = (ushort)(bVar5 >> 6 & 1) * auVar23._60_2_;
        auVar24._62_2_ = (ushort)(bVar5 >> 7) * auVar23._62_2_;
        auVar23 = vmovdqu16_avx512bw(*(undefined1 (*) [64])(pfVar8 + uVar7 + uVar10));
        auVar15._2_2_ = (ushort)((byte)(uVar13 >> 1) & 1) * auVar23._2_2_;
        auVar15._0_2_ = (ushort)(bVar2 & 1) * auVar23._0_2_;
        auVar15._4_2_ = (ushort)((byte)(uVar13 >> 2) & 1) * auVar23._4_2_;
        auVar15._6_2_ = (ushort)((byte)(uVar13 >> 3) & 1) * auVar23._6_2_;
        auVar15._8_2_ = (ushort)((byte)(uVar13 >> 4) & 1) * auVar23._8_2_;
        auVar15._10_2_ = (ushort)((byte)(uVar13 >> 5) & 1) * auVar23._10_2_;
        auVar15._12_2_ = (ushort)((byte)(uVar13 >> 6) & 1) * auVar23._12_2_;
        auVar15._14_2_ = (ushort)((byte)(uVar13 >> 7) & 1) * auVar23._14_2_;
        auVar15._16_2_ = (ushort)(bVar3 & 1) * auVar23._16_2_;
        auVar15._18_2_ = (ushort)((byte)(uVar13 >> 9) & 1) * auVar23._18_2_;
        auVar15._20_2_ = (ushort)((byte)(uVar13 >> 10) & 1) * auVar23._20_2_;
        auVar15._22_2_ = (ushort)((byte)(uVar13 >> 0xb) & 1) * auVar23._22_2_;
        auVar15._24_2_ = (ushort)((byte)(uVar13 >> 0xc) & 1) * auVar23._24_2_;
        auVar15._26_2_ = (ushort)((byte)(uVar13 >> 0xd) & 1) * auVar23._26_2_;
        auVar15._28_2_ = (ushort)((byte)(uVar13 >> 0xe) & 1) * auVar23._28_2_;
        auVar15._30_2_ = (ushort)((byte)(uVar13 >> 0xf) & 1) * auVar23._30_2_;
        auVar25._32_2_ = (ushort)(bVar4 & 1) * auVar23._32_2_;
        auVar25._0_32_ = auVar15;
        auVar25._34_2_ = (ushort)((byte)(uVar12 >> 1) & 1) * auVar23._34_2_;
        auVar25._36_2_ = (ushort)((byte)(uVar12 >> 2) & 1) * auVar23._36_2_;
        auVar25._38_2_ = (ushort)((byte)(uVar12 >> 3) & 1) * auVar23._38_2_;
        auVar25._40_2_ = (ushort)((byte)(uVar12 >> 4) & 1) * auVar23._40_2_;
        auVar25._42_2_ = (ushort)((byte)(uVar12 >> 5) & 1) * auVar23._42_2_;
        auVar25._44_2_ = (ushort)((byte)(uVar12 >> 6) & 1) * auVar23._44_2_;
        auVar25._46_2_ = (ushort)((byte)(uVar12 >> 7) & 1) * auVar23._46_2_;
        auVar25._48_2_ = (ushort)(bVar5 & 1) * auVar23._48_2_;
        auVar25._50_2_ = (ushort)(bVar5 >> 1 & 1) * auVar23._50_2_;
        auVar25._52_2_ = (ushort)(bVar5 >> 2 & 1) * auVar23._52_2_;
        auVar25._54_2_ = (ushort)(bVar5 >> 3 & 1) * auVar23._54_2_;
        auVar25._56_2_ = (ushort)(bVar5 >> 4 & 1) * auVar23._56_2_;
        auVar25._58_2_ = (ushort)(bVar5 >> 5 & 1) * auVar23._58_2_;
        auVar25._60_2_ = (ushort)(bVar5 >> 6 & 1) * auVar23._60_2_;
        auVar25._62_2_ = (ushort)(bVar5 >> 7) * auVar23._62_2_;
        auVar23 = vpmovzxwd_avx512f(auVar14);
        auVar14 = vextracti64x4_avx512f(auVar24,1);
        auVar24 = vpmovzxwd_avx512f(auVar14);
        auVar26 = vpmovzxwd_avx512f(auVar15);
        auVar14 = vextracti64x4_avx512f(auVar25,1);
        auVar25 = vpmovzxwd_avx512f(auVar14);
        auVar27 = vpaddd_avx512f(auVar25,auVar24);
        auVar28 = vpaddd_avx512f(auVar26,auVar23);
        auVar29 = vpsrld_avx512f(auVar28,0x10);
        auVar30 = vpsrld_avx512f(auVar27,0x10);
        auVar27 = vpaddd_avx512f(auVar30,auVar27);
        auVar28 = vpaddd_avx512f(auVar29,auVar28);
        auVar14 = vpmovdw_avx512f(auVar28);
        auVar15 = vpmovdw_avx512f(auVar27);
        auVar24 = vpsubd_avx512f(auVar24,auVar25);
        auVar23 = vpsubd_avx512f(auVar23,auVar26);
        auVar25 = vpsrld_avx512f(auVar23,0x10);
        auVar26 = vpsrld_avx512f(auVar24,0x10);
        auVar24 = vpaddd_avx512f(auVar26,auVar24);
        auVar23 = vpaddd_avx512f(auVar25,auVar23);
        auVar16 = vpmovdw_avx512f(auVar23);
        auVar17 = vpmovdw_avx512f(auVar24);
        auVar23 = vinserti64x4_avx512f(ZEXT3264(auVar14),auVar15,1);
        auVar24 = vinserti64x4_avx512f(ZEXT3264(auVar16),auVar17,1);
        auVar23 = vmovdqu16_avx512bw(auVar23);
        *(undefined1 (*) [64])(pfVar8 + uVar10) = auVar23;
        auVar23 = vmovdqu16_avx512bw(auVar24);
        *(undefined1 (*) [64])(pfVar8 + uVar7 + uVar10) = auVar23;
        uVar10 = uVar10 + 0x20;
      } while ((uVar6 + 0x1f & 0xffffffe0) != uVar10);
      lVar9 = lVar9 + uVar7 * 2;
      pfVar8 = pfVar8 + uVar7 * 2;
    } while ((short)((ulong)lVar9 >> 0x10) == 0);
    bVar11 = uVar6 < 0x8000;
    uVar6 = uVar6 * 2;
  } while (bVar11);
  return;
}

Assistant:

static void FWHT(fwht_t* data, const unsigned bits)
{
    const unsigned size = (unsigned)(1UL << bits);
    for (unsigned width = 1; width < size; width <<= 1)
        for (unsigned i = 0; i < size; i += (width << 1))
            for (unsigned j = i; j < (width + i); ++j)
                FWHT_2(data[j], data[j + width]);
}